

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer * Serialize(FSerializer *arc,char *key,int32_t *value,int32_t *defval)

{
  uint uVar1;
  FWriter *pFVar2;
  int iVar3;
  Value *this;
  
  pFVar2 = arc->w;
  if (pFVar2 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      if ((*(byte *)((long)&this->data_ + 0x16) & 0x20) == 0) {
        __assert_fail("val->IsInt()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x506,
                      "FSerializer &Serialize(FSerializer &, const char *, int32_t &, int32_t *)");
      }
      iVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(this);
      *value = iVar3;
    }
  }
  else {
    uVar1 = (pFVar2->mInObject).Count;
    if ((((uVar1 == 0) || (defval == (int32_t *)0x0)) ||
        ((pFVar2->mInObject).Array[uVar1 - 1] == false)) || (*value != *defval)) {
      FSerializer::WriteKey(arc,key);
      FWriter::Int(arc->w,*value);
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, int32_t &value, int32_t *defval)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || defval == nullptr || value != *defval)
		{
			arc.WriteKey(key);
			arc.w->Int(value);
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsInt());
			if (val->IsInt())
			{
				value = val->GetInt();
			}
			else
			{
				Printf(TEXTCOLOR_RED "integer type expected for '%s'", key);
				arc.mErrors++;
			}
		}
	}
	return arc;
}